

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O1

void ctype_preptype(CTRepr *ctr,CType *ct,CTInfo qual,char *t)

{
  uint64_t uVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  uint uVar5;
  
  uVar1 = (ct->name).gcptr64;
  if (uVar1 == 0) {
    if (ctr->needsp != 0) {
      pcVar3 = ctr->pb;
      if (ctr->buf < pcVar3) {
        ctr->pb = pcVar3 + -1;
        pcVar3[-1] = ' ';
      }
      else {
        ctr->ok = 0;
      }
    }
    pcVar3 = ctr->pb;
    if (pcVar3 < ctr->buf + 0xb) {
      ctr->ok = 0;
    }
    else {
      uVar5 = (int)((ulong)((long)ct - (long)ctr->cts->tab) >> 3) * -0x55555555;
      do {
        pcVar3[-1] = (char)uVar5 + (char)(uVar5 / 10) * -10 | 0x30;
        pcVar3 = pcVar3 + -1;
        bVar2 = 9 < uVar5;
        uVar5 = uVar5 / 10;
      } while (bVar2);
      ctr->pb = pcVar3;
      ctr->needsp = 0;
    }
    ctr->needsp = 1;
  }
  else {
    ctype_prepstr(ctr,(char *)(uVar1 + 0x18),*(MSize *)(uVar1 + 0x14));
  }
  sVar4 = strlen(t);
  ctype_prepstr(ctr,t,(MSize)sVar4);
  ctype_prepqual(ctr,qual);
  return;
}

Assistant:

static void ctype_preptype(CTRepr *ctr, CType *ct, CTInfo qual, const char *t)
{
  if (gcref(ct->name)) {
    GCstr *str = gco2str(gcref(ct->name));
    ctype_prepstr(ctr, strdata(str), str->len);
  } else {
    if (ctr->needsp) ctype_prepc(ctr, ' ');
    ctype_prepnum(ctr, ctype_typeid(ctr->cts, ct));
    ctr->needsp = 1;
  }
  ctype_prepstr(ctr, t, (MSize)strlen(t));
  ctype_prepqual(ctr, qual);
}